

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Fraction * __thiscall Matrix::At(Matrix *this,int i,int j)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  
  uVar4 = (ulong)i;
  pvVar1 = (this->elements_).
           super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->elements_).
                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar5 = uVar4;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    uVar5 = (ulong)j;
    lVar2 = *(long *)&pvVar1[uVar4].super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                      super__Vector_impl_data;
    uVar3 = (long)*(pointer *)
                   ((long)&pvVar1[uVar4].super__Vector_base<Fraction,_std::allocator<Fraction>_>.
                           _M_impl.super__Vector_impl_data + 8) - lVar2 >> 3;
    if (uVar5 < uVar3) {
      return (Fraction *)(lVar2 + uVar5 * 8);
    }
  }
  pcVar6 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar3
            );
  return (Fraction *)(ulong)*(uint *)pcVar6;
}

Assistant:

Fraction& Matrix::At(int i, int j) {
  return elements_.at(i).at(j);
}